

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int ar_equation_system_solve(aom_noise_state_t *state,int is_chroma)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  iVar2 = equation_system_solve(&state->eqns);
  state->ar_gain = 1.0;
  if (iVar2 != 0) {
    iVar1 = (state->eqns).n;
    dVar7 = 0.0;
    dVar9 = 0.0;
    uVar3 = iVar1 - is_chroma;
    if (uVar3 != 0 && is_chroma <= iVar1) {
      iVar4 = 0;
      uVar5 = (ulong)uVar3;
      do {
        dVar9 = dVar9 + (state->eqns).A[iVar4] / (double)state->num_observations;
        iVar4 = iVar4 + iVar1 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    if (0 < (int)uVar3) {
      dVar7 = 0.0;
      uVar5 = 0;
      lVar6 = (long)(iVar1 + -1);
      do {
        dVar8 = (state->eqns).b[uVar5];
        if (is_chroma != 0) {
          dVar8 = dVar8 - (state->eqns).A[lVar6] * (state->eqns).x[iVar1 + -1];
        }
        dVar7 = dVar7 + (dVar8 * (state->eqns).x[uVar5]) / (double)state->num_observations;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + iVar1;
      } while (uVar3 != uVar5);
    }
    dVar7 = dVar9 / (double)(int)uVar3 - dVar7;
    if (dVar7 <= 1e-06) {
      dVar7 = 1e-06;
    }
    dVar7 = (dVar9 / (double)(int)uVar3) / dVar7;
    if (dVar7 <= 1e-06) {
      dVar7 = 1e-06;
    }
    if (dVar7 < 0.0) {
      dVar9 = sqrt(dVar7);
    }
    else {
      dVar9 = SQRT(dVar7);
    }
    dVar8 = 1.0;
    if (1.0 <= dVar9) {
      if (dVar7 < 0.0) {
        dVar8 = sqrt(dVar7);
      }
      else {
        dVar8 = SQRT(dVar7);
      }
    }
    state->ar_gain = dVar8;
  }
  return iVar2;
}

Assistant:

static int ar_equation_system_solve(aom_noise_state_t *state, int is_chroma) {
  const int ret = equation_system_solve(&state->eqns);
  state->ar_gain = 1.0;
  if (!ret) return ret;

  // Update the AR gain from the equation system as it will be used to fit
  // the noise strength as a function of intensity.  In the Yule-Walker
  // equations, the diagonal should be the variance of the correlated noise.
  // In the case of the least squares estimate, there will be some variability
  // in the diagonal. So use the mean of the diagonal as the estimate of
  // overall variance (this works for least squares or Yule-Walker formulation).
  double var = 0;
  const int n = state->eqns.n;
  for (int i = 0; i < (state->eqns.n - is_chroma); ++i) {
    var += state->eqns.A[i * n + i] / state->num_observations;
  }
  var /= (n - is_chroma);

  // Keep track of E(Y^2) = <b, x> + E(X^2)
  // In the case that we are using chroma and have an estimate of correlation
  // with luma we adjust that estimate slightly to remove the correlated bits by
  // subtracting out the last column of a scaled by our correlation estimate
  // from b. E(y^2) = <b - A(:, end)*x(end), x>
  double sum_covar = 0;
  for (int i = 0; i < state->eqns.n - is_chroma; ++i) {
    double bi = state->eqns.b[i];
    if (is_chroma) {
      bi -= state->eqns.A[i * n + (n - 1)] * state->eqns.x[n - 1];
    }
    sum_covar += (bi * state->eqns.x[i]) / state->num_observations;
  }
  // Now, get an estimate of the variance of uncorrelated noise signal and use
  // it to determine the gain of the AR filter.
  const double noise_var = AOMMAX(var - sum_covar, 1e-6);
  state->ar_gain = AOMMAX(1, sqrt(AOMMAX(var / noise_var, 1e-6)));
  return ret;
}